

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O1

pair<CMutableTransaction,_long> * __thiscall
TestChain100Setup::CreateValidTransaction
          (pair<CMutableTransaction,_long> *__return_storage_ptr__,TestChain100Setup *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *input_transactions,vector<COutPoint,_std::allocator<COutPoint>_> *inputs,int input_height
          ,vector<CKey,_std::allocator<CKey>_> *input_signing_keys,
          vector<CTxOut,_std::allocator<CTxOut>_> *outputs,optional<CFeeRate> *feerate,
          optional<unsigned_int> *fee_output)

{
  pointer pCVar1;
  CKey *pCVar2;
  pointer psVar3;
  bool bVar4;
  ulong uVar5;
  int64_t iVar6;
  CAmount CVar7;
  pointer pCVar8;
  ulong uVar9;
  CKey *input_signing_key;
  pointer pCVar10;
  CKey *this_00;
  long lVar11;
  shared_ptr<const_CTransaction> *input_transaction;
  pointer psVar12;
  long in_FS_OFFSET;
  CAmount current_fee;
  CCoinsView coins_view;
  CMutableTransaction mempool_txn;
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  input_errors;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  input_coins;
  CCoinsViewCache coins_cache;
  FillableSigningProvider keystore;
  long local_3c0;
  CCoinsView local_3b8;
  CMutableTransaction local_3b0;
  undefined1 local_378 [48];
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_348;
  uchar local_328 [48];
  undefined1 local_2f8 [8];
  _Rb_tree_node_base local_2f0;
  ulong local_2d0;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  local_2c8;
  CCoinsViewCache local_298;
  SigningProvider local_c8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_c0;
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  local_90;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_3b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::reserve
            (&local_3b0.vin,
             ((long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::reserve
            (&local_3b0.vout,
             ((long)(outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  pCVar10 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar10 != pCVar1) {
    do {
      local_298.m_deterministic = false;
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_298.hashBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_298.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView = (_func_int **)0x0;
      local_298.super_CCoinsViewBacked.base = (CCoinsView *)0x0;
      std::vector<CTxIn,std::allocator<CTxIn>>::
      emplace_back<COutPoint_const&,CScript,unsigned_int_const&>
                ((vector<CTxIn,std::allocator<CTxIn>> *)&local_3b0,pCVar10,(CScript *)&local_298,
                 &MAX_BIP125_RBF_SEQUENCE);
      if (0x1c < (uint)local_298.hashBlock.super_base_blob<256U>.m_data._M_elems._11_4_) {
        free(local_298.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView);
        local_298.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView = (_func_int **)0x0;
      }
      pCVar10 = pCVar10 + 1;
    } while (pCVar10 != pCVar1);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator=(&local_3b0.vout,outputs);
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c8._vptr_SigningProvider = (_func_int **)&PTR__FillableSigningProvider_013bce20;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58 = 0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_60 = 0;
  local_48 = 0;
  uStack_40 = 0;
  uStack_50 = 1;
  this_00 = (input_signing_keys->super__Vector_base<CKey,_std::allocator<CKey>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar2 = (input_signing_keys->super__Vector_base<CKey,_std::allocator<CKey>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this_00 != pCVar2) {
    do {
      CKey::GetPubKey((CPubKey *)&local_298,this_00);
      (*local_c8._vptr_SigningProvider[10])(&local_c8,this_00,&local_298);
      this_00 = this_00 + 1;
    } while (this_00 != pCVar2);
  }
  local_3b8._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_013bb510;
  CCoinsViewCache::CCoinsViewCache(&local_298,&local_3b8,false);
  psVar12 = (input_transactions->
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (input_transactions->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar12 != psVar3) {
    do {
      AddCoins(&local_298,
               (psVar12->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               input_height,false);
      psVar12 = psVar12 + 1;
    } while (psVar12 != psVar3);
  }
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c8._M_impl.super__Rb_tree_header._M_header;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar11 = 0;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar10 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pCVar10 != pCVar1) {
    lVar11 = 0;
    do {
      CTxOut::CTxOut((CTxOut *)local_2f8);
      local_2d0 = local_2d0 & 0xffffffff00000000;
      bVar4 = CCoinsViewCache::GetCoin(&local_298,pCVar10,(Coin *)local_2f8);
      if (!bVar4) {
        __assert_fail("coins_cache.GetCoin(outpoint_to_spend, utxo_to_spend)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                      ,0x1b5,
                      "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                     );
      }
      local_378._32_4_ = pCVar10->n;
      local_378._0_8_ =
           *(undefined8 *)(pCVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_378._8_8_ =
           *(undefined8 *)((pCVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      local_378._16_8_ =
           *(undefined8 *)((pCVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      local_378._24_8_ =
           *(undefined8 *)((pCVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      local_378._40_8_ = local_2f8;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                (&local_348,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_2f0);
      uVar5 = local_2d0;
      local_328[0] = (uchar)local_2d0;
      local_328[1] = local_2d0._1_1_;
      local_328[2] = local_2d0._2_1_;
      local_328[3] = local_2d0._3_1_;
      local_2d0 = uVar5;
      std::
      _Rb_tree<COutPoint,std::pair<COutPoint_const,Coin>,std::_Select1st<std::pair<COutPoint_const,Coin>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,Coin>>>
      ::_M_insert_unique<std::pair<COutPoint_const,Coin>>
                ((_Rb_tree<COutPoint,std::pair<COutPoint_const,Coin>,std::_Select1st<std::pair<COutPoint_const,Coin>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,Coin>>>
                  *)&local_2c8,(pair<const_COutPoint,_Coin> *)local_378);
      if (0x1c < local_348._size) {
        free(local_348._union.indirect_contents.indirect);
        local_348._union.indirect_contents.indirect = (char *)0x0;
      }
      lVar11 = (long)(CAmount *)local_2f8 + lVar11;
      if (0x1c < local_2f0._M_right._4_4_) {
        free((void *)local_2f0._0_8_);
        local_2f0._0_8_ = (char *)0x0;
      }
      pCVar10 = pCVar10 + 1;
    } while (pCVar10 != pCVar1);
  }
  local_2f0._M_left = &local_2f0;
  local_2f0._0_8_ = local_2f0._0_8_ & 0xffffffff00000000;
  local_2f0._M_parent = (_Base_ptr)0x0;
  local_2d0 = 0;
  local_2f0._M_right = local_2f0._M_left;
  bVar4 = SignTransaction(&local_3b0,&local_c8,
                          (map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                           *)&local_2c8,1,
                          (map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                           *)local_2f8);
  if (!bVar4) {
    __assert_fail("SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x1bc,
                  "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                 );
  }
  local_3c0 = 0;
  for (pCVar8 = (outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pCVar8 != (outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                super__Vector_impl_data._M_finish; pCVar8 = pCVar8 + 1) {
    local_3c0 = local_3c0 + pCVar8->nValue;
  }
  local_3c0 = lVar11 - local_3c0;
  lVar11 = local_3c0;
  if ((feerate->super__Optional_base<CFeeRate,_true,_true>)._M_payload.
      super__Optional_payload_base<CFeeRate>._M_engaged == true) {
    if ((fee_output->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      __assert_fail("fee_output.has_value()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                    ,0x1c3,
                    "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                   );
    }
    uVar9 = (ulong)(fee_output->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_payload._M_value;
    uVar5 = ((long)local_3b0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_3b0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    if (uVar5 < uVar9 || uVar5 - uVar9 == 0) {
      __assert_fail("fee_output.value() < mempool_txn.vout.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                    ,0x1c4,
                    "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                   );
    }
    CTransaction::CTransaction((CTransaction *)local_378,&local_3b0);
    iVar6 = GetVirtualTransactionSize((CTransaction *)local_378,0,0);
    CVar7 = CFeeRate::GetFee((CFeeRate *)feerate,(uint32_t)iVar6);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_378 + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_378);
    lVar11 = local_3c0;
    if (CVar7 - local_3c0 != 0 && local_3c0 <= CVar7) {
      if ((fee_output->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
        goto LAB_00848628;
      }
      local_3b0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start
      [(fee_output->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload._M_value].nValue =
           local_3b0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start
           [(fee_output->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value].nValue -
           (CVar7 - local_3c0);
      std::
      _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
      ::clear((_Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
               *)local_2f8);
      bVar4 = SignTransaction(&local_3b0,&local_c8,
                              (map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                               *)&local_2c8,1,
                              (map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                               *)local_2f8);
      lVar11 = CVar7;
      if (!bVar4) {
        __assert_fail("SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                      ,0x1cd,
                      "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                     );
      }
    }
  }
  local_3c0 = lVar11;
  std::pair<CMutableTransaction,_long>::pair<CMutableTransaction_&,_long_&,_true>
            (__return_storage_ptr__,&local_3b0,&local_3c0);
  std::
  _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
               *)local_2f8);
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  ::~_Rb_tree(&local_2c8);
  local_298.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_013bb490;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_298.cacheCoins._M_h);
  if (local_298.m_sentinel.second.m_flags != '\0') {
    ((local_298.m_sentinel.second.m_next)->second).m_prev = local_298.m_sentinel.second.m_prev;
    ((local_298.m_sentinel.second.m_prev)->second).m_next = local_298.m_sentinel.second.m_next;
    local_298.m_sentinel.second.m_flags = '\0';
  }
  if (0x1c < local_298.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(local_298.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.
         indirect_contents.indirect);
    local_298.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
    indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource(&local_298.m_cache_coins_memory_resource);
  local_c8._vptr_SigningProvider = (_func_int **)&PTR__FillableSigningProvider_013bce20;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_c0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_3b0.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_3b0.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00848628:
  __stack_chk_fail();
}

Assistant:

std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef>& input_transactions,
                                                                                  const std::vector<COutPoint>& inputs,
                                                                                  int input_height,
                                                                                  const std::vector<CKey>& input_signing_keys,
                                                                                  const std::vector<CTxOut>& outputs,
                                                                                  const std::optional<CFeeRate>& feerate,
                                                                                  const std::optional<uint32_t>& fee_output)
{
    CMutableTransaction mempool_txn;
    mempool_txn.vin.reserve(inputs.size());
    mempool_txn.vout.reserve(outputs.size());

    for (const auto& outpoint : inputs) {
        mempool_txn.vin.emplace_back(outpoint, CScript(), MAX_BIP125_RBF_SEQUENCE);
    }
    mempool_txn.vout = outputs;

    // - Add the signing key to a keystore
    FillableSigningProvider keystore;
    for (const auto& input_signing_key : input_signing_keys) {
        keystore.AddKey(input_signing_key);
    }
    // - Populate a CoinsViewCache with the unspent output
    CCoinsView coins_view;
    CCoinsViewCache coins_cache(&coins_view);
    for (const auto& input_transaction : input_transactions) {
        AddCoins(coins_cache, *input_transaction.get(), input_height);
    }
    // Build Outpoint to Coin map for SignTransaction
    std::map<COutPoint, Coin> input_coins;
    CAmount inputs_amount{0};
    for (const auto& outpoint_to_spend : inputs) {
        // - Use GetCoin to properly populate utxo_to_spend,
        Coin utxo_to_spend;
        assert(coins_cache.GetCoin(outpoint_to_spend, utxo_to_spend));
        input_coins.insert({outpoint_to_spend, utxo_to_spend});
        inputs_amount += utxo_to_spend.out.nValue;
    }
    // - Default signature hashing type
    int nHashType = SIGHASH_ALL;
    std::map<int, bilingual_str> input_errors;
    assert(SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors));
    CAmount current_fee = inputs_amount - std::accumulate(outputs.begin(), outputs.end(), CAmount(0),
        [](const CAmount& acc, const CTxOut& out) {
        return acc + out.nValue;
    });
    // Deduct fees from fee_output to meet feerate if set
    if (feerate.has_value()) {
        assert(fee_output.has_value());
        assert(fee_output.value() < mempool_txn.vout.size());
        CAmount target_fee = feerate.value().GetFee(GetVirtualTransactionSize(CTransaction{mempool_txn}));
        CAmount deduction = target_fee - current_fee;
        if (deduction > 0) {
            // Only deduct fee if there's anything to deduct. If the caller has put more fees than
            // the target feerate, don't change the fee.
            mempool_txn.vout[fee_output.value()].nValue -= deduction;
            // Re-sign since an output has changed
            input_errors.clear();
            assert(SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors));
            current_fee = target_fee;
        }
    }
    return {mempool_txn, current_fee};
}